

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

bool isAscii_helper(char16_t **ptr,char16_t *end)

{
  bool bVar1;
  char16_t *pcVar2;
  long in_FS_OFFSET;
  char *ptr8;
  char16_t *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = *ptr;
  bVar1 = simdTestMask((char **)&local_28,(char *)end,0xff80ff80);
  *ptr = local_28;
  if (bVar1) {
    pcVar2 = local_28;
    if (local_28 == end) {
      bVar1 = true;
    }
    else {
      do {
        bVar1 = (ushort)*pcVar2 < 0x80;
        if (0x7f < (ushort)*pcVar2) break;
        pcVar2 = pcVar2 + 1;
        *ptr = pcVar2;
      } while (pcVar2 != end);
    }
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool isAscii_helper(const char16_t *&ptr, const char16_t *end)
{
#ifdef __SSE2__
    const char *ptr8 = reinterpret_cast<const char *>(ptr);
    const char *end8 = reinterpret_cast<const char *>(end);
    bool ok = simdTestMask(ptr8, end8, 0xff80ff80);
    ptr = reinterpret_cast<const char16_t *>(ptr8);
    if (!ok)
        return false;
#endif

    while (ptr != end) {
        if (*ptr & 0xff80)
            return false;
        ++ptr;
    }
    return true;
}